

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O3

void * parseDblpRoot(SymbolContext<char> *ctx)

{
  int iVar1;
  long lVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  
  iVar1 = ctx->num_values;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      local_28 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)ctx->values[lVar2];
      if (result_abi_cxx11_.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          result_abi_cxx11_.
          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*>>
        ::_M_realloc_insert<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*>
                  ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*>>
                    *)&result_abi_cxx11_,
                   (iterator)
                   result_abi_cxx11_.
                   super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_28);
        iVar1 = ctx->num_values;
      }
      else {
        *result_abi_cxx11_.
         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_28;
        result_abi_cxx11_.
        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             result_abi_cxx11_.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return &result_abi_cxx11_;
}

Assistant:

int count() const
  {
    return num_values;
  }